

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O1

TestStatus *
vkt::synchronization::anon_unknown_0::multiSubmissionCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice *ppVVar1;
  long lVar2;
  long *plVar3;
  VkFence obj;
  deUint32 queueFamilyIndex;
  VkResult VVar4;
  int iVar5;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar6;
  long lVar7;
  Move<vk::Handle<(vk::HandleType)10>_> local_1d8;
  VkCommandBuffer cmdBuffers [2];
  VkFence fence [2];
  VkEvent local_188;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_180;
  VkCommandPool local_168;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_160;
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  Move<vk::Handle<(vk::HandleType)6>_> ptrFence [2];
  VkSubmitInfo submitInfo [2];
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar6 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence(ptrFence,vk,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::createFence(ptrFence + 1,vk,device,0,(VkAllocationCallbacks *)0x0);
  fence[0].m_internal =
       ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  fence[1].m_internal =
       ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  DStack_160.m_device = (VkDevice)submitInfo[0]._16_8_;
  DStack_160.m_allocator = (VkAllocationCallbacks *)submitInfo[0].pWaitSemaphores;
  local_168.m_internal = submitInfo[0]._0_8_;
  DStack_160.m_deviceIface = (DeviceInterface *)submitInfo[0].pNext;
  makeCommandBuffer(ptrCmdBuffer,vk,device,(VkCommandPool)submitInfo[0]._0_8_);
  makeCommandBuffer(ptrCmdBuffer + 1,vk,device,local_168);
  cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  memset(submitInfo,0,0x90);
  submitInfo[0].sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo[0].commandBufferCount = 1;
  submitInfo[0].pCommandBuffers = cmdBuffers;
  submitInfo[1].sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo[1].commandBufferCount = 1;
  submitInfo[1].pCommandBuffers = cmdBuffers + 1;
  ::vk::createEvent(&local_1d8,vk,device,0,(VkAllocationCallbacks *)0x0);
  DStack_180.m_device =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  DStack_180.m_allocator =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  local_188.m_internal =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_180.m_deviceIface =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  beginCommandBuffer(vk,cmdBuffers[0]);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,cmdBuffers[0],local_188.m_internal,1);
  endCommandBuffer(vk,cmdBuffers[0]);
  beginCommandBuffer(vk,cmdBuffers[1]);
  (*vk->_vptr_DeviceInterface[0x6c])(vk,cmdBuffers[1],1,&local_188,1,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk,cmdBuffers[1]);
  VVar4 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar6,1,submitInfo,fence[0].m_internal);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo[SET], fence[SET])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x106);
  VVar4 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar6,1,submitInfo + 1,fence[1].m_internal);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo[WAIT], fence[WAIT])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x107);
  iVar5 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,2,fence,1,0xffffffffffffffff);
  ppVVar1 = &local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal =
       (deUint64)ppVVar1;
  if (iVar5 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,"Wait and set even on device multi submission tests pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,"Queue should end execution","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal));
  }
  if ((VkDevice *)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal
      != ppVVar1) {
    operator_delete((void *)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                            m_internal,
                    (ulong)(local_1d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                            m_device + 1));
  }
  if (local_188.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_180,local_188);
  }
  lVar7 = 0x20;
  do {
    lVar2 = *(long *)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object +
                     lVar7);
    if (lVar2 != 0) {
      plVar3 = *(long **)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                 deleter.m_deviceIface + lVar7);
      submitInfo[0]._0_8_ = lVar2;
      (**(code **)(*plVar3 + 0x240))
                (plVar3,*(undefined8 *)
                         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                 deleter.m_device + lVar7),
                 *(undefined8 *)
                  ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                          m_pool.m_internal + lVar7),1,submitInfo);
    }
    *(undefined8 *)
     ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + lVar7)
         = 0;
    *(undefined8 *)
     ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal
     + lVar7) = 0;
    *(undefined8 *)
     ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar7) = 0;
    *(undefined8 *)
     ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface +
     lVar7) = 0;
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  if (local_168.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_160,local_168);
  }
  lVar7 = 0;
  do {
    obj.m_internal =
         *(deUint64 *)
          ((long)&ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
          + lVar7);
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                 ((long)&ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                         m_deviceIface + lVar7),obj);
    }
    *(undefined8 *)
     ((long)&ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device +
     lVar7) = 0;
    *(undefined8 *)
     ((long)&ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator +
     lVar7) = 0;
    *(undefined8 *)
     ((long)&ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal +
     lVar7) = 0;
    *(undefined8 *)
     ((long)&ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface
     + lVar7) = 0;
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multiSubmissionCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Move<VkFence>				ptrFence[COUNT]		=
	{
		createFence(vk, device),
		createFence(vk, device)
	};
	VkFence							fence[COUNT]		= {*ptrFence[SET], *ptrFence[WAIT]};
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
	VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[SET], *ptrCmdBuffer[WAIT]};
	const VkSubmitInfo				submitInfo[COUNT]	=
														{
															{
																VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																DE_NULL,						// const void*					pNext;
																0u,								// deUint32						waitSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																1u,								// deUint32						commandBufferCount;
																&cmdBuffers[SET],				// const VkCommandBuffer*		pCommandBuffers;
																0u,								// deUint32						signalSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
															},
															{
																VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																DE_NULL,						// const void*					pNext;
																0u,								// deUint32						waitSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																1u,								// deUint32						commandBufferCount;
																&cmdBuffers[WAIT],				// const VkCommandBuffer*		pCommandBuffers;
																0u,								// deUint32						signalSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
															}
														};
	const Unique<VkEvent>			event				(createEvent(vk, device));

	beginCommandBuffer(vk, cmdBuffers[SET]);
	vk.cmdSetEvent(cmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, cmdBuffers[SET]);

	beginCommandBuffer(vk, cmdBuffers[WAIT]);
	vk.cmdWaitEvents(cmdBuffers[WAIT], 1u, &event.get(), VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, cmdBuffers[WAIT]);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo[SET], fence[SET]));
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo[WAIT], fence[WAIT]));

	if (VK_SUCCESS != vk.waitForFences(device, 2u, fence, DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device multi submission tests pass");
}